

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMMemTest.cpp
# Opt level: O1

int mymain(void)

{
  char *pMessage;
  
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  DOMBasicTests();
  DOMNSTests();
  DOMReleaseTests();
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 0;
}

Assistant:

int  mymain()
{
    try {
        XMLPlatformUtils::Initialize();
    }
    catch (const XMLException& toCatch) {
        char *pMessage = XMLString::transcode(toCatch.getMessage());
        fprintf(stderr, "Error during XMLPlatformUtils::Initialize(). \n"
            "  Message is: %s\n", pMessage);
        XMLString::release(&pMessage);
        return -1;
    }

    DOMBasicTests();
    DOMNSTests();
    DOMReleaseTests();

    //
    //  Print Final allocation stats for full set of tests
    //
    XMLPlatformUtils::Terminate();

    return 0;

}